

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O0

void __thiscall gvr::ColoredPointCloud::loadPLY(ColoredPointCloud *this,PLYReader *ply)

{
  uint uVar1;
  bool bVar2;
  ply_type pVar3;
  long lVar4;
  string *in_RSI;
  ColoredPointCloud *in_RDI;
  UInt8Receiver cb;
  UInt8Receiver cg;
  UInt8Receiver cr;
  ply_type type;
  float scale;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  int vn;
  size_t in_stack_fffffffffffff2a8;
  string *in_stack_fffffffffffff2b0;
  allocator *paVar5;
  PLYReader *in_stack_fffffffffffff2b8;
  UInt8Receiver *in_stack_fffffffffffff2c0;
  PLYReader *this_00;
  PLYReader *in_stack_fffffffffffff2c8;
  PLYReader *this_01;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  Model *in_stack_fffffffffffff4f0;
  bool local_af5;
  bool local_a8d;
  allocator local_a41;
  string local_a40 [39];
  undefined1 local_a19 [40];
  undefined1 local_9f1 [40];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [135];
  allocator local_711;
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [36];
  ply_type local_624;
  undefined4 local_620;
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [135];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [135];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [133];
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228 [37];
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar4 = PLYReader::instancesOfElement(in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar4;
  Model::setOriginFromPLY
            (in_stack_fffffffffffff4f0,
             (PLYReader *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
  uVar1 = local_14;
  std::allocator<char>::allocator();
  local_c2 = 0;
  local_c3 = 0;
  local_ea = 0;
  local_eb = 0;
  local_112 = 0;
  local_113 = 0;
  local_13a = 0;
  local_13b = 0;
  std::__cxx11::string::string(local_70,"vertex",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"scan_size",&local_99);
  pVar3 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                     &in_stack_fffffffffffff2b8->filename);
  local_a8d = true;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string(local_c0,"vertex",&local_c1);
    local_c3 = 1;
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string(local_e8,"scan_error",&local_e9);
    local_eb = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                       &in_stack_fffffffffffff2b8->filename);
    local_a8d = true;
    if (pVar3 == ply_none) {
      std::allocator<char>::allocator();
      local_112 = 1;
      std::__cxx11::string::string(local_110,"vertex",&local_111);
      local_113 = 1;
      std::allocator<char>::allocator();
      local_13a = 1;
      std::__cxx11::string::string(local_138,"scan_conf",&local_139);
      local_13b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                         &in_stack_fffffffffffff2b8->filename);
      local_a8d = pVar3 != ply_none;
    }
  }
  std::allocator<char>::allocator();
  local_1b2 = 0;
  local_1b3 = 0;
  local_1da = 0;
  local_1db = 0;
  local_202 = 0;
  local_203 = 0;
  local_22a = 0;
  local_22b = 0;
  std::__cxx11::string::string(local_160,"vertex",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"sx",&local_189);
  pVar3 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                     &in_stack_fffffffffffff2b8->filename);
  local_af5 = false;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string(local_1b0,"vertex",&local_1b1);
    local_1b3 = 1;
    paVar5 = &local_1d9;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,"sy",paVar5);
    local_1db = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                       &in_stack_fffffffffffff2b8->filename);
    local_af5 = false;
    if (pVar3 != ply_none) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string(local_200,"vertex",&local_201);
      local_203 = 1;
      std::allocator<char>::allocator();
      local_22a = 1;
      std::__cxx11::string::string(local_228,"sz",&local_229);
      local_22b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                         &in_stack_fffffffffffff2b8->filename);
      local_af5 = pVar3 != ply_none;
    }
  }
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[9])
            (in_RDI,(ulong)uVar1,(ulong)local_a8d,(ulong)local_af5);
  if ((local_22b & 1) != 0) {
    std::__cxx11::string::~string(local_228);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"vertex",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"x",&local_2d9);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"vertex",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"y",&local_329);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vertex",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"z",&local_379);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"vertex",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"scan_size",&local_429);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"vertex",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"scan_error",&local_479);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"vertex",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"scan_conf",&local_4c9);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff2c0,(float *)in_stack_fffffffffffff2b8,
             (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"vertex",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"sx",&local_579);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"vertex",&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c8,"sy",&local_5c9);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"vertex",&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"sz",&local_619);
    PLYReader::setReceiver
              (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
               &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  }
  local_620 = 0x3f800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"vertex",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"diffuse_red",&local_671);
  pVar3 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                     &in_stack_fffffffffffff2b8->filename);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  local_624 = pVar3;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_698,"vertex",&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c0,"red",&local_6c1);
    local_624 = PLYReader::getTypeOfProperty
                          (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                           &in_stack_fffffffffffff2b8->filename);
    std::__cxx11::string::~string(local_6c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    std::__cxx11::string::~string(local_698);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
  }
  if (local_624 == ply_none) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e8,"vertex",&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_710,"r",&local_711);
    local_624 = PLYReader::getTypeOfProperty
                          (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
                           &in_stack_fffffffffffff2b8->filename);
    std::__cxx11::string::~string(local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    std::__cxx11::string::~string(local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  }
  if (local_624 == ply_uint16) {
    local_620 = 0x3b800000;
  }
  if ((local_624 == ply_float32) || (local_624 == ply_float64)) {
    local_620 = 0x437f0000;
  }
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            (in_stack_fffffffffffff2c0,(uchar *)in_stack_fffffffffffff2b8,
             (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),SUB84(in_stack_fffffffffffff2b0,0));
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            (in_stack_fffffffffffff2c0,(uchar *)in_stack_fffffffffffff2b8,
             (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),SUB84(in_stack_fffffffffffff2b0,0));
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            (in_stack_fffffffffffff2c0,(uchar *)in_stack_fffffffffffff2b8,
             (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),SUB84(in_stack_fffffffffffff2b0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"vertex",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"diffuse_red",&local_7c1);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"vertex",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"diffuse_green",&local_811);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"vertex",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"diffuse_blue",&local_861);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"vertex",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"red",&local_8b1);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"vertex",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_900,"green",&local_901);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"vertex",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"blue",&local_951);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"vertex",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a0,"r",&local_9a1);
  PLYReader::setReceiver
            (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->filename,(PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"vertex",&local_9c9);
  this_01 = (PLYReader *)local_9f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_9f1 + 1),"g",(allocator *)this_01);
  PLYReader::setReceiver
            (this_01,(string *)in_stack_fffffffffffff2c0,&in_stack_fffffffffffff2b8->filename,
             (PLYReceiver *)in_stack_fffffffffffff2b0);
  std::__cxx11::string::~string((string *)(local_9f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_9f1);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  this_00 = (PLYReader *)local_a19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a19 + 1),"vertex",(allocator *)this_00);
  paVar5 = &local_a41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a40,"b",paVar5);
  PLYReader::setReceiver(this_01,&this_00->filename,local_10,(PLYReceiver *)paVar5);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  std::__cxx11::string::~string((string *)(local_a19 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a19);
  PLYReader::readData(this_00);
  return;
}

Assistant:

void ColoredPointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // set receiver for color

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // read data

  ply.readData();
}